

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceDecomposition::unpackSelfData(ForceDecomposition *this,SelfData *sdat,int atom)

{
  Vector<double,_7U>::operator=(&this->selfPot,&sdat->selfPot);
  Vector<double,_7U>::operator=(&this->selectedSelfPot,&sdat->selePot);
  if ((this->atomStorageLayout_ & 0x10000) != 0) {
    (this->snap_->atomData).flucQFrc.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[atom] = sdat->flucQfrc;
  }
  return;
}

Assistant:

void ForceDecomposition::unpackSelfData(SelfData& sdat, int atom) {
    selfPot         = sdat.selfPot;
    selectedSelfPot = sdat.selePot;

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      snap_->atomData.flucQFrc[atom] = sdat.flucQfrc;
    }
  }